

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,long sizeLimit)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  undefined8 local_440;
  char buffer [1024];
  
  std::__cxx11::string::assign((char *)line);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    bVar4 = false;
    bVar3 = false;
    local_440 = line;
    while ((!bVar3 && (sizeLimit != 0))) {
      std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
      std::istream::getline((char *)is,(long)buffer);
      uVar1 = *(ulong *)(is + 8);
      if ((long)uVar1 < 1) break;
      sVar2 = strlen(buffer);
      if (sVar2 < uVar1) {
        bVar3 = true;
      }
      if ((sVar2 != 0) && (buffer[sVar2 - 1] == '\r')) {
        buffer[sVar2 - 1] = '\0';
      }
      lVar5 = sizeLimit;
      if ((0 < sizeLimit) && (lVar5 = sizeLimit - sVar2, sizeLimit < (long)sVar2)) {
        buffer[sizeLimit + -1] = '\0';
        lVar5 = 0;
      }
      std::__cxx11::string::append((char *)local_440);
      bVar4 = true;
      sizeLimit = lVar5;
    }
  }
  else {
    bVar3 = false;
    bVar4 = false;
  }
  if (has_newline != (bool *)0x0) {
    *has_newline = bVar3;
  }
  return bVar4;
}

Assistant:

bool SystemTools::GetLineFromStream(std::istream& is,
                                    std::string& line,
                                    bool* has_newline /* = 0 */,
                                    long sizeLimit /* = -1 */)
{
  const int bufferSize = 1024;
  char buffer[bufferSize];
  bool haveData = false;
  bool haveNewline = false;

  // Start with an empty line.
  line = "";

  long leftToRead = sizeLimit;

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if(!is)
    {
    if(has_newline)
      {
      *has_newline = false;
      }
    return false;
    }

  // If no characters are read from the stream, the end of file has
  // been reached.  Clear the fail bit just before reading.
  while(!haveNewline &&
        leftToRead != 0 &&
        (is.clear(is.rdstate() & ~std::ios::failbit),
         is.getline(buffer, bufferSize), is.gcount() > 0))
    {
    // We have read at least one byte.
    haveData = true;

    // If newline character was read the gcount includes the character
    // but the buffer does not: the end of line has been reached.
    size_t length = strlen(buffer);
    if(length < static_cast<size_t>(is.gcount()))
      {
      haveNewline = true;
      }

    // Avoid storing a carriage return character.
    if(length > 0 && buffer[length-1] == '\r')
      {
      buffer[length-1] = 0;
      }

    // if we read too much then truncate the buffer
    if (leftToRead > 0)
      {
      if (static_cast<long>(length) > leftToRead)
        {
        buffer[leftToRead-1] = 0;
        leftToRead = 0;
        }
      else
        {
        leftToRead -= static_cast<long>(length);
        }
      }

    // Append the data read to the line.
    line.append(buffer);
    }

  // Return the results.
  if(has_newline)
    {
    *has_newline = haveNewline;
    }
  return haveData;
}